

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  int iVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  RepeatedPtrFieldBase local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((RepeatedFieldAccessor *)this == other_mutator) {
    if (data != other_data) {
      if (*(long *)((long)data + 0x10) != *(long *)((long)other_data + 0x10)) {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)data,(RepeatedPtrFieldBase *)other_data);
        return;
      }
      uVar1 = *data;
      uVar2 = *(undefined8 *)((long)data + 8);
      uVar3 = *(undefined8 *)((long)other_data + 8);
      *(undefined8 *)data = *other_data;
      *(undefined8 *)((long)data + 8) = uVar3;
      *(undefined8 *)other_data = uVar1;
      *(undefined8 *)((long)other_data + 8) = uVar2;
    }
  }
  else {
    local_68.tagged_rep_or_elem_ = (void *)0x0;
    local_68.current_size_ = 0;
    local_68.capacity_proxy_ = 0;
    local_68.arena_ = (Arena *)0x0;
    if (&local_68 != (RepeatedPtrFieldBase *)data) {
      if (*(long *)((long)data + 0x10) == 0) {
        local_68.tagged_rep_or_elem_ = *data;
        local_68._8_8_ = *(undefined8 *)((long)data + 8);
        *(undefined8 *)data = 0;
        *(undefined8 *)((long)data + 8) = 0;
      }
      else {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  (&local_68,(RepeatedPtrFieldBase *)data);
      }
    }
    iVar4 = (**(code **)(*(long *)other_mutator + 8))(other_mutator,other_data);
    if (0 < iVar4) {
      iVar6 = 0;
      do {
        RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,iVar6);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  ((RepeatedFieldAccessor *)this,data,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        iVar6 = iVar6 + 1;
      } while (iVar4 != iVar6);
    }
    lVar5 = (**(code **)((long)*this + 0x80))(this,data);
    iVar4 = *(int *)(lVar5 + 8);
    (**(code **)(*(long *)other_mutator + 0x18))(other_mutator,other_data);
    if (0 < iVar4) {
      iVar6 = 0;
      do {
        value = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&local_68,iVar6);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  (other_mutator,other_data,value);
        iVar6 = iVar6 + 1;
      } while (iVar4 != iVar6);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_68);
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<std::string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<std::string>(data, other_mutator->Get<std::string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<std::string>(other_data, tmp.Get(i));
      }
    }
  }